

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  int *pRc;
  int *piVar1;
  int iVar2;
  Fts5Hash *p_00;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Fts5Iter *pIter;
  Fts5Data *pFVar7;
  code *pcVar8;
  Fts5HashEntry *pData;
  u32 nData;
  long lVar9;
  Fts5StructureSegment *pSeg;
  u8 *puVar10;
  Fts5SegIter *pFVar11;
  Fts5StructureLevel *pFVar12;
  ulong uVar13;
  long lVar14;
  Fts5HashEntry *pFVar15;
  
  uVar13 = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar13 = (ulong)((uint)((flags & 0x40U) == 0 && p->pHash != (Fts5Hash *)0x0) +
                      pStruct->nSegment);
    }
    else {
      uVar4 = pStruct->aLevel[(uint)iLevel].nSeg;
      if ((int)uVar4 < nSegment) {
        nSegment = uVar4;
      }
      uVar13 = (ulong)(uint)nSegment;
    }
  }
  pIter = fts5MultiIterAlloc(p,(int)uVar13);
  *ppOut = pIter;
  if (pIter != (Fts5Iter *)0x0) {
    pRc = &p->rc;
    pIter->bRev = (uint)flags >> 1 & 1;
    pIter->bSkipEmpty = (byte)flags >> 4 & 1;
    pIter->pColset = pColset;
    if ((flags & 0x20U) == 0) {
      fts5IterSetOutputCb(pRc,pIter);
    }
    if (*pRc == 0) {
      if (iLevel < 0) {
        iVar2 = pStruct->nLevel;
        p_00 = p->pHash;
        iVar5 = 0;
        if ((char)((flags & 0x40U) >> 6) == '\0' && p_00 != (Fts5Hash *)0x0) {
          if ((flags & 8U) == 0 && pTerm != (u8 *)0x0) {
            if (nTerm < 1) {
              uVar4 = 0xd;
            }
            else {
              lVar14 = (ulong)(uint)nTerm + 1;
              uVar4 = 0xd;
              do {
                uVar4 = uVar4 * 8 ^ uVar4 ^ (uint)pTerm[lVar14 + -2];
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            pFVar15 = p_00->aSlot[(ulong)uVar4 % (ulong)(uint)p_00->nSlot];
            if (pFVar15 == (Fts5HashEntry *)0x0) {
              iVar5 = 0;
              pFVar7 = (Fts5Data *)0x0;
LAB_001e6507:
              iVar6 = 0;
            }
            else {
              do {
                if ((pFVar15->nKey == nTerm) &&
                   (iVar5 = bcmp(pFVar15 + 1,pTerm,(long)nTerm), iVar5 == 0)) {
                  lVar14 = (long)pFVar15->nData - (long)(nTerm + 0x30);
                  iVar5 = sqlite3_initialize();
                  if (iVar5 == 0) {
                    pFVar7 = (Fts5Data *)sqlite3Malloc(lVar14 + 0x1a);
                  }
                  else {
                    pFVar7 = (Fts5Data *)0x0;
                  }
                  if (pFVar7 == (Fts5Data *)0x0) {
                    iVar5 = 0;
                    iVar6 = 7;
                    goto LAB_001e6513;
                  }
                  iVar5 = (int)lVar14;
                  memcpy(pFVar7 + 1,(void *)((long)&pFVar15->pHashNext + (long)(nTerm + 0x30)),
                         (long)iVar5);
                  iVar6 = fts5HashAddPoslistSize
                                    (p_00,pFVar15,
                                     (Fts5HashEntry *)((long)&pFVar7->p + (long)(-0x20 - nTerm)));
                  iVar5 = iVar5 + iVar6;
                  goto LAB_001e6507;
                }
                pFVar15 = pFVar15->pHashNext;
              } while (pFVar15 != (Fts5HashEntry *)0x0);
              iVar5 = 0;
              pFVar7 = (Fts5Data *)0x0;
              iVar6 = 0;
            }
LAB_001e6513:
            *pRc = iVar6;
            if (pFVar7 != (Fts5Data *)0x0) {
              pFVar7->p = (u8 *)(pFVar7 + 1);
            }
            piVar1 = &pIter->aSeg[0].flags;
            *(byte *)piVar1 = (byte)*piVar1 | 1;
            pData = (Fts5HashEntry *)pTerm;
            nData = nTerm;
          }
          else {
            iVar5 = sqlite3Fts5HashScanInit(p_00,(char *)pTerm,nTerm);
            p->rc = iVar5;
            pFVar15 = p->pHash->pScan;
            if (pFVar15 == (Fts5HashEntry *)0x0) {
              pData = (Fts5HashEntry *)0x0;
              nData = 0;
              puVar10 = (u8 *)0x0;
              iVar5 = 0;
            }
            else {
              pData = pFVar15 + 1;
              nData = pFVar15->nKey;
              fts5HashAddPoslistSize(p->pHash,pFVar15,(Fts5HashEntry *)0x0);
              puVar10 = (u8 *)((long)&pFVar15[1].pHashNext + (long)(int)nData);
              iVar5 = (pFVar15->nData - nData) + -0x30;
            }
            if (puVar10 == (u8 *)0x0) {
              pFVar7 = (Fts5Data *)0x0;
            }
            else {
              pFVar7 = (Fts5Data *)sqlite3Fts5MallocZero(pRc,0x10);
              if (pFVar7 != (Fts5Data *)0x0) {
                pFVar7->p = puVar10;
              }
            }
            p->bDelete = 0;
          }
          if (pFVar7 != (Fts5Data *)0x0) {
            pIter->aSeg[0].term.n = 0;
            sqlite3Fts5BufferAppendBlob(pRc,&pIter->aSeg[0].term,nData,(u8 *)pData);
            pFVar7->szLeaf = iVar5;
            pFVar7->nn = iVar5;
            pIter->aSeg[0].pLeaf = pFVar7;
            bVar3 = sqlite3Fts5GetVarint(pFVar7->p,(u64 *)&pIter->aSeg[0].iRowid);
            pIter->aSeg[0].iLeafOffset = (ulong)bVar3;
            pIter->aSeg[0].iEndofDoclist = pFVar7->nn;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,pIter->aSeg);
            }
            else {
              piVar1 = &pIter->aSeg[0].flags;
              *(byte *)piVar1 = (byte)*piVar1 | 2;
              fts5SegIterReverseInitPage(p,pIter->aSeg);
            }
          }
          if ((pIter->aSeg[0].flags & 2) == 0) {
            if (p->pConfig->eDetail == 1) {
              pcVar8 = fts5SegIterNext_None;
            }
            else {
              pcVar8 = fts5SegIterNext;
            }
          }
          else {
            pcVar8 = fts5SegIterNext_Reverse;
          }
          pIter->aSeg[0].xNext = pcVar8;
          iVar5 = 1;
        }
        if (0 < iVar2) {
          pFVar12 = pStruct->aLevel;
          do {
            lVar14 = (long)pFVar12->nSeg;
            if (0 < lVar14) {
              pFVar11 = pIter->aSeg + iVar5;
              lVar9 = lVar14 + 1;
              iVar5 = iVar5 + pFVar12->nSeg;
              lVar14 = lVar14 * 0x38;
              do {
                pSeg = (Fts5StructureSegment *)((long)&pFVar12->aSeg[-1].iSegid + lVar14);
                if (pTerm == (u8 *)0x0) {
                  fts5SegIterInit(p,pSeg,pFVar11);
                }
                else {
                  fts5SegIterSeekInit(p,pTerm,nTerm,flags,pSeg,pFVar11);
                }
                pFVar11 = pFVar11 + 1;
                lVar9 = lVar9 + -1;
                lVar14 = lVar14 + -0x38;
              } while (1 < lVar9);
            }
            pFVar12 = pFVar12 + 1;
          } while (pFVar12 < pStruct->aLevel + iVar2);
        }
      }
      else if (0 < (int)uVar13) {
        pFVar11 = pIter->aSeg;
        lVar14 = uVar13 * 0x38 + -0x38;
        do {
          fts5SegIterInit(p,(Fts5StructureSegment *)
                            ((long)&(pStruct->aLevel[(uint)iLevel].aSeg)->iSegid + lVar14),pFVar11);
          lVar14 = lVar14 + -0x38;
          pFVar11 = pFVar11 + 1;
        } while (lVar14 != -0x38);
      }
    }
    if (*pRc == 0) {
      fts5MultiIterFinishSetup(p,pIter);
      return;
    }
    fts5MultiIterFree(pIter);
    *ppOut = (Fts5Iter *)0x0;
  }
  return;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH));
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ){
    assert( p->rc!=SQLITE_OK );
    goto fts5MultiIterNew_post_check;
  }
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH) ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterator now points
  ** to the first entry in its segment. In this case initialize the
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    fts5MultiIterFinishSetup(p, pNew);
  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }

fts5MultiIterNew_post_check:
  assert( (*ppOut)!=0 || p->rc!=SQLITE_OK );
  return;
}